

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MFMSectorDump.cpp
# Opt level: O0

void __thiscall
Storage::Disk::MFMSectorDump::set_tracks
          (MFMSectorDump *this,
          map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
          *tracks)

{
  uint8_t first_sector;
  uint8_t sector_size;
  Density density;
  Address AVar1;
  _func_int *p_Var2;
  long lVar3;
  MFMSectorDump *pMVar4;
  void *__buf;
  uint8_t *puVar5;
  bool bVar6;
  byte last_sector;
  int iVar7;
  reference ppVar8;
  element_type *track_00;
  undefined4 extraout_var;
  mutex *__m;
  size_t __n;
  FileHolder *pFVar9;
  undefined8 uStack_a0;
  uint8_t auStack_98 [8];
  FileHolder *local_90;
  MFMSectorDump *local_88;
  void *local_80;
  uint8_t *local_78;
  lock_guard<std::mutex> local_60;
  lock_guard<std::mutex> lock_guard;
  long file_offset;
  pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_> *track;
  const_iterator __end1;
  const_iterator __begin1;
  map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
  *__range1;
  unsigned_long __vla_expr0;
  map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
  *tracks_local;
  MFMSectorDump *this_local;
  
  local_80 = (void *)(ulong)(uint)((0x80 << (this->sector_size_ & 0x1f)) * this->sectors_per_track_)
  ;
  lVar3 = -(long)local_80;
  local_78 = auStack_98 + lVar3;
  local_88 = this;
  *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x9720a2;
  __end1 = std::
           map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
           ::begin(tracks);
  *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x9720af;
  track = (pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_> *)
          std::
          map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
          ::end(tracks);
  while( true ) {
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x9720c0;
    bVar6 = std::operator!=(&__end1,(_Self *)&track);
    if (!bVar6) break;
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x9720d2;
    ppVar8 = std::
             _Rb_tree_const_iterator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>
             ::operator*(&__end1);
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x9720e3;
    track_00 = std::
               __shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ppVar8->second);
    puVar5 = local_78;
    first_sector = local_88->first_sector_;
    density = local_88->density_;
    last_sector = (char)local_88->sectors_per_track_ + -1 + first_sector;
    sector_size = local_88->sector_size_;
    __n = (size_t)last_sector;
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x97211e;
    decode_sectors(track_00,puVar5,first_sector,last_sector,sector_size,density);
    pMVar4 = local_88;
    AVar1 = ppVar8->first;
    p_Var2 = (local_88->super_DiskImage)._vptr_DiskImage[9];
    lock_guard._M_device = (mutex_type *)AVar1;
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x97213a;
    iVar7 = (*p_Var2)(pMVar4,AVar1);
    pFVar9 = &local_88->file_;
    local_90 = pFVar9;
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x972152;
    __m = FileHolder::get_file_access_mutex(pFVar9);
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x97215e;
    std::lock_guard<std::mutex>::lock_guard(&local_60,__m);
    pFVar9 = local_90;
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x97216e;
    FileHolder::ensure_is_at_least_length(pFVar9,CONCAT44(extraout_var,iVar7));
    pFVar9 = &local_88->file_;
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x972183;
    FileHolder::seek(pFVar9,CONCAT44(extraout_var,iVar7),0);
    puVar5 = local_78;
    __buf = local_80;
    pFVar9 = &local_88->file_;
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x97219a;
    FileHolder::write(pFVar9,(int)puVar5,__buf,__n);
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x9721a5;
    std::lock_guard<std::mutex>::~lock_guard(&local_60);
    *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x9721ae;
    std::
    _Rb_tree_const_iterator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>
    ::operator++(&__end1);
  }
  pFVar9 = &local_88->file_;
  *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x9721d7;
  FileHolder::flush(pFVar9);
  return;
}

Assistant:

void MFMSectorDump::set_tracks(const std::map<Track::Address, std::shared_ptr<Track>> &tracks) {
	uint8_t parsed_track[(128 << sector_size_)*sectors_per_track_];

	// TODO: it would be more efficient from a file access and locking point of view to parse the sectors
	// in one loop, then write in another.

	for(const auto &track : tracks) {
		decode_sectors(
			*track.second,
			parsed_track,
			first_sector_,
			first_sector_ + uint8_t(sectors_per_track_-1),
			sector_size_,
			density_);
		const long file_offset = get_file_offset_for_position(track.first);

		std::lock_guard lock_guard(file_.get_file_access_mutex());
		file_.ensure_is_at_least_length(file_offset);
		file_.seek(file_offset, SEEK_SET);
		file_.write(parsed_track, sizeof(parsed_track));
	}
	file_.flush();
}